

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void dfct(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  double dVar1;
  uint nc;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  iVar14 = *ip;
  if (iVar14 * 8 < n) {
    iVar14 = n >> 3;
    makewt(iVar14,ip,w);
  }
  uVar7 = n >> 1;
  nc = ip[1];
  if (ip[1] * 2 < n) {
    makect(uVar7,ip,w + iVar14);
    nc = uVar7;
  }
  lVar8 = (long)(int)uVar7;
  dVar17 = a[lVar8];
  lVar3 = (long)n;
  dVar19 = *a + a[lVar3];
  *a = *a - a[lVar3];
  *t = dVar19 - dVar17;
  t[lVar8] = dVar19 + dVar17;
  if (n < 3) {
    a[1] = *a;
    a[2] = *t;
    dVar17 = t[1];
  }
  else {
    uVar15 = (ulong)(uVar7 >> 1);
    if (3 < uVar7) {
      lVar4 = 1;
      lVar6 = -lVar8;
      lVar2 = lVar8 * 8 + -8;
      lVar11 = 0;
      do {
        lVar6 = lVar6 + 1;
        dVar17 = *(double *)((long)a + lVar11 + lVar3 * 8 + -8);
        dVar16 = a[lVar4] + dVar17;
        dVar19 = *(double *)((long)a + lVar11 + lVar2);
        dVar1 = a[lVar3 + lVar6];
        dVar18 = dVar19 + dVar1;
        a[lVar4] = a[lVar4] - dVar17;
        *(double *)((long)a + lVar11 + lVar2) = dVar19 - dVar1;
        t[lVar4] = dVar16 - dVar18;
        *(double *)((long)t + lVar11 + lVar8 * 8 + -8) = dVar18 + dVar16;
        lVar4 = lVar4 + 1;
        lVar11 = lVar11 + -8;
      } while (uVar15 * 8 + -8 + lVar11 != 0);
    }
    iVar13 = n - (uVar7 >> 1);
    t[uVar15] = a[uVar15] + a[iVar13];
    a[uVar15] = a[uVar15] - a[iVar13];
    c = w + iVar14;
    dctsub(uVar7,a,nc,c);
    if ((int)uVar7 < 5) {
      if (uVar7 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(uVar7,ip + 2,a);
      cftfsub(uVar7,a,w);
      rftfsub(uVar7,a,nc,c);
    }
    a[(ulong)(uint)n - 1] = *a - a[1];
    a[1] = *a + a[1];
    if (3 < (int)uVar7) {
      uVar5 = (ulong)uVar7 + 2;
      lVar8 = (ulong)uVar7 << 3;
      do {
        dVar17 = a[uVar5 - 4];
        *(double *)((long)a + lVar8 * 2 + -0x18) = a[uVar5 - 3] + dVar17;
        *(double *)((long)a + lVar8 * 2 + -0x28) = dVar17 - a[uVar5 - 3];
        uVar5 = uVar5 - 2;
        lVar8 = lVar8 + -0x10;
      } while (5 < uVar5);
    }
    lVar8 = 2;
    if (3 < uVar7) {
      iVar14 = 2;
      do {
        uVar7 = (uint)uVar15;
        dctsub(uVar7,t,nc,c);
        if (uVar7 < 5) {
          if (uVar7 == 4) {
            cftfsub(4,t,w);
          }
        }
        else {
          bitrv2(uVar7,ip + 2,t);
          cftfsub(uVar7,t,w);
          rftfsub(uVar7,t,nc,c);
        }
        a[n - iVar14] = *t - t[1];
        lVar8 = (long)iVar14;
        a[lVar8] = *t + t[1];
        if (2 < uVar7) {
          uVar5 = 2;
          lVar6 = (long)(iVar14 * 4);
          do {
            a[lVar6 - lVar8] = t[uVar5] - t[uVar5 + 1];
            a[lVar8 + lVar6] = t[uVar5] + t[uVar5 + 1];
            uVar5 = uVar5 + 2;
            lVar6 = lVar6 + iVar14 * 4;
          } while (uVar5 < uVar15);
        }
        iVar14 = iVar14 * 2;
        uVar5 = uVar15 >> 1;
        uVar9 = uVar5;
        pdVar10 = t;
        pdVar12 = t;
        if (uVar7 < 2) {
          t[uVar5] = t[uVar15];
          break;
        }
        do {
          dVar17 = pdVar12[uVar15];
          *pdVar12 = pdVar10[uVar15 * 2] - dVar17;
          pdVar10[uVar15] = dVar17 + pdVar10[uVar15 * 2];
          uVar9 = uVar9 - 1;
          pdVar10 = pdVar10 + -1;
          pdVar12 = pdVar12 + 1;
        } while (uVar9 != 0);
        t[uVar5] = t[(int)uVar5 + uVar7];
        uVar15 = uVar5;
      } while (3 < uVar7);
      lVar8 = (long)iVar14;
    }
    a[lVar8] = *t;
    a[lVar3] = t[2] - t[1];
    dVar17 = t[2] + t[1];
  }
  *a = dVar17;
  return;
}

Assistant:

void dfct(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dctsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    m = n >> 1;
    yi = a[m];
    xi = a[0] + a[n];
    a[0] -= a[n];
    t[0] = xi - yi;
    t[m] = xi + yi;
    if (n > 2) {
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] - a[n - j];
            xi = a[j] + a[n - j];
            yr = a[k] - a[n - k];
            yi = a[k] + a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi - yi;
            t[k] = xi + yi;
        }
        t[mh] = a[mh] + a[n - mh];
        a[mh] -= a[n - mh];
        dctsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[0] - a[1];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] + a[j + 1];
            a[2 * j - 1] = a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dctsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[0] - t[1];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = t[j] - t[j + 1];
                a[k + l] = t[j] + t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 0; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] - t[m + j];
                t[k] = t[m + k] + t[m + j];
            }
            t[mh] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
        a[n] = t[2] - t[1];
        a[0] = t[2] + t[1];
    } else {
        a[1] = a[0];
        a[2] = t[0];
        a[0] = t[1];
    }
}